

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResonanceChannels.test.cpp
# Opt level: O3

void verifyChunk(ResonanceChannels *chunk)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  bool bVar2;
  int iVar3;
  member_size_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_&>
  n;
  long lVar4;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  AssertionHandler catchAssertionHandler;
  AssertionHandler local_1e0;
  undefined1 local_198 [8];
  undefined8 local_190;
  vector<double,_std::allocator<double>_> *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  undefined8 local_170;
  undefined1 local_168;
  undefined1 local_167;
  undefined1 local_160 [9];
  bool bStack_157;
  undefined6 uStack_156;
  undefined4 uStack_154;
  ITransientExpression *local_150;
  WithinRelMatcher *local_148;
  long local_140;
  ITransientExpression local_138;
  iterator_t<CRng> *local_128;
  WithinRelMatcher *local_120;
  iterator_t<CRng> local_118;
  undefined1 *local_110;
  double local_108;
  iterator_t<CRng> local_100;
  undefined1 *local_f8;
  iterator_t<CRng> local_f0;
  undefined1 *local_e8;
  iterator_t<CRng> local_e0;
  undefined1 *local_d8;
  iterator_t<CRng> local_d0;
  undefined1 *local_c8;
  iterator_t<CRng> local_c0;
  undefined1 *local_b8;
  iterator_t<CRng> local_b0;
  undefined1 *local_a8;
  iterator_t<CRng> local_a0;
  undefined1 *local_98;
  iterator_t<CRng> local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  iterator_t<CRng> local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  iterator_t<CRng> local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  iterator_t<CRng> local_48;
  undefined8 *local_40;
  undefined1 *local_38;
  
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xb3;
  macroName.m_size = 10;
  macroName.m_start = "CHECK_THAT";
  capturedExpression.m_size = 0x1c;
  capturedExpression.m_start = "0.5, WithinRel( chunk.AJ() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName,(SourceLineInfo *)local_198,capturedExpression,ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x3fe0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (chunk->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xb4;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x1e;
  capturedExpression_00.m_start = "0.5, WithinRel( chunk.spin() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_00,(SourceLineInfo *)local_198,capturedExpression_00,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x3fe0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (chunk->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Head_base<0UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xb5;
  macroName_01.m_size = 10;
  macroName_01.m_start = "CHECK_THAT";
  capturedExpression_01.m_size = 0x1b;
  capturedExpression_01.m_start = "0., WithinRel( chunk.PJ() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_01,(SourceLineInfo *)local_198,capturedExpression_01,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (chunk->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xb6;
  macroName_02.m_size = 10;
  macroName_02.m_start = "CHECK_THAT";
  capturedExpression_02.m_size = 0x1f;
  capturedExpression_02.m_start = "0., WithinRel( chunk.parity() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_02,(SourceLineInfo *)local_198,capturedExpression_02,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (chunk->super_ListRecord).metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xb7;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x10;
  capturedExpression_03.m_start = "0 == chunk.KBK()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_03,(SourceLineInfo *)local_198,capturedExpression_03,
             ContinueOnFailure);
  local_180._8_8_ =
       (chunk->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_190._1_1_ = local_180._8_8_ == 0;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0320;
  local_190 = local_190 & 0xffffffff;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xb8;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x25;
  capturedExpression_04.m_start = "0 == chunk.numberBackgroundChannels()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_04,(SourceLineInfo *)local_198,capturedExpression_04,
             ContinueOnFailure);
  local_180._8_8_ =
       (chunk->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  local_190._1_1_ = local_180._8_8_ == 0;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0320;
  local_190 = local_190 & 0xffffffff;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xb9;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x10;
  capturedExpression_05.m_start = "0 == chunk.KPS()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_05,(SourceLineInfo *)local_198,capturedExpression_05,
             ContinueOnFailure);
  local_180._8_8_ =
       (chunk->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_190._1_1_ = local_180._8_8_ == 0;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0320;
  local_190 = local_190 & 0xffffffff;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xba;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x1d;
  capturedExpression_06.m_start = "0 == chunk.phaseShiftOption()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_06,(SourceLineInfo *)local_198,capturedExpression_06,
             ContinueOnFailure);
  local_180._8_8_ =
       (chunk->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_190._1_1_ = local_180._8_8_ == 0;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0320;
  local_190 = local_190 & 0xffffffff;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xbb;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x10;
  capturedExpression_07.m_start = "2 == chunk.NCH()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_07,(SourceLineInfo *)local_198,capturedExpression_07,
             ContinueOnFailure);
  iVar3 = (int)(((long)(chunk->super_ListRecord).data.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(chunk->super_ListRecord).data.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) / 6);
  local_190._1_1_ = iVar3 == 2;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0360;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  local_180._8_4_ = iVar3;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xbc;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x1b;
  capturedExpression_08.m_start = "2 == chunk.numberChannels()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_08,(SourceLineInfo *)local_198,capturedExpression_08,
             ContinueOnFailure);
  iVar3 = (int)(((long)(chunk->super_ListRecord).data.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(chunk->super_ListRecord).data.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3) / 6);
  local_190._1_1_ = iVar3 == 2;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0360;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  local_180._8_4_ = iVar3;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xbe;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x17;
  capturedExpression_09.m_start = "2 == chunk.PPI().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_09,(SourceLineInfo *)local_198,capturedExpression_09,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xbf;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x27;
  capturedExpression_10.m_start = "2 == chunk.particlePairNumbers().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_10,(SourceLineInfo *)local_198,capturedExpression_10,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xc0;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x15;
  capturedExpression_11.m_start = "2 == chunk.L().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_11,(SourceLineInfo *)local_198,capturedExpression_11,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-8 - (long)(chunk->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xc1;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x29;
  capturedExpression_12.m_start = "2 == chunk.orbitalMomentumValues().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_12,(SourceLineInfo *)local_198,capturedExpression_12,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-8 - (long)(chunk->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xc2;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x17;
  capturedExpression_13.m_start = "2 == chunk.SCH().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_13,(SourceLineInfo *)local_198,capturedExpression_13,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x10 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xc3;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x25;
  capturedExpression_14.m_start = "2 == chunk.channelSpinValues().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_14,(SourceLineInfo *)local_198,capturedExpression_14,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x10 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xc4;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x17;
  capturedExpression_15.m_start = "2 == chunk.BND().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_15,(SourceLineInfo *)local_198,capturedExpression_15,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x18 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xc5;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x2b;
  capturedExpression_16.m_start = "2 == chunk.boundaryConditionValues().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_16,(SourceLineInfo *)local_198,capturedExpression_16,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x18 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xc6;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x17;
  capturedExpression_17.m_start = "2 == chunk.APT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_17,(SourceLineInfo *)local_198,capturedExpression_17,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x28 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xc7;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x24;
  capturedExpression_18.m_start = "2 == chunk.trueChannelRadii().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_18,(SourceLineInfo *)local_198,capturedExpression_18,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x28 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xc8;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x17;
  capturedExpression_19.m_start = "2 == chunk.APE().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_19,(SourceLineInfo *)local_198,capturedExpression_19,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x20 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xc9;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x29;
  capturedExpression_20.m_start = "2 == chunk.effectiveChannelRadii().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_20,(SourceLineInfo *)local_198,capturedExpression_20,
             ContinueOnFailure);
  lVar4 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x20 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_180._8_8_ = (lVar4 + 5U) / 6;
  local_190._1_1_ = lVar4 - 7U < 6;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03a0;
  local_190._4_4_ = 2;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  pvVar1 = &(chunk->super_ListRecord).data;
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xcb;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x13;
  capturedExpression_21.m_start = "1 == chunk.PPI()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_21,(SourceLineInfo *)local_198,capturedExpression_21,
             ContinueOnFailure);
  iVar3 = (int)*(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_190._1_1_ = iVar3 == 1;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03e0;
  local_190._4_4_ = 1;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  local_180._8_4_ = iVar3;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xcc;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x13;
  capturedExpression_22.m_start = "2 == chunk.PPI()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_22,(SourceLineInfo *)local_198,capturedExpression_22,
             ContinueOnFailure);
  local_90._M_current =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  lVar4 = ((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)local_90._M_current >> 3) % 6;
  local_180._8_8_ = 6 - lVar4;
  if (lVar4 == 0) {
    local_180._8_8_ = 0;
  }
  local_180._M_allocated_capacity = 6;
  local_170._0_2_ = CONCAT11(1,(undefined1)local_170);
  local_88 = &local_190;
  local_188 = pvVar1;
  local_80 = &local_170;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_88,&local_90,1);
  bStack_157 = (int)*local_90._M_current == 2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d03e0;
  uStack_154 = 2;
  local_150 = (ITransientExpression *)0x1957cd;
  local_148 = (WithinRelMatcher *)0x2;
  local_140 = CONCAT44(local_140._4_4_,(int)*local_90._M_current);
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xcd;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x23;
  capturedExpression_23.m_start = "1 == chunk.particlePairNumbers()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_23,(SourceLineInfo *)local_198,capturedExpression_23,
             ContinueOnFailure);
  iVar3 = (int)*(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_190._1_1_ = iVar3 == 1;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03e0;
  local_190._4_4_ = 1;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  local_180._8_4_ = iVar3;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xce;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x23;
  capturedExpression_24.m_start = "2 == chunk.particlePairNumbers()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_24,(SourceLineInfo *)local_198,capturedExpression_24,
             ContinueOnFailure);
  local_78._M_current =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  lVar4 = ((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)local_78._M_current >> 3) % 6;
  local_180._8_8_ = 6 - lVar4;
  if (lVar4 == 0) {
    local_180._8_8_ = 0;
  }
  local_180._M_allocated_capacity = 6;
  local_170._0_2_ = CONCAT11(1,(undefined1)local_170);
  local_70 = &local_190;
  local_188 = pvVar1;
  local_68 = &local_170;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_70,&local_78,1);
  bStack_157 = (int)*local_78._M_current == 2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d03e0;
  uStack_154 = 2;
  local_150 = (ITransientExpression *)0x1957cd;
  local_148 = (WithinRelMatcher *)0x2;
  local_140 = CONCAT44(local_140._4_4_,(int)*local_78._M_current);
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xcf;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x11;
  capturedExpression_25.m_start = "0 == chunk.L()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_25,(SourceLineInfo *)local_198,capturedExpression_25,
             ContinueOnFailure);
  iVar3 = (int)(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[1];
  local_190._1_1_ = iVar3 == 0;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03e0;
  local_190 = local_190 & 0xffffffff;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  local_180._8_4_ = iVar3;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xd0;
  macroName_26.m_size = 5;
  macroName_26.m_start = "CHECK";
  capturedExpression_26.m_size = 0x11;
  capturedExpression_26.m_start = "1 == chunk.L()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_26,(SourceLineInfo *)local_198,capturedExpression_26,
             ContinueOnFailure);
  local_188 = (vector<double,_std::allocator<double>_> *)
              (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_180._M_allocated_capacity =
       (size_type)
       ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start + 1);
  lVar4 = ((long)((long)local_188 - local_180._M_allocated_capacity) >> 3) % 6;
  local_170 = (double)(6 - lVar4);
  if (lVar4 == 0) {
    local_170 = 0.0;
  }
  local_180._8_8_ = 6;
  local_167 = 1;
  local_58 = &local_190;
  local_60._M_current = (double *)local_180._M_allocated_capacity;
  local_50 = &local_168;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_58,&local_60,1);
  bStack_157 = (int)*local_60._M_current == 1;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d03e0;
  uStack_154 = 1;
  local_150 = (ITransientExpression *)0x1957cd;
  local_148 = (WithinRelMatcher *)0x2;
  local_140 = CONCAT44(local_140._4_4_,(int)*local_60._M_current);
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xd1;
  macroName_27.m_size = 5;
  macroName_27.m_start = "CHECK";
  capturedExpression_27.m_size = 0x25;
  capturedExpression_27.m_start = "0 == chunk.orbitalMomentumValues()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_27,(SourceLineInfo *)local_198,capturedExpression_27,
             ContinueOnFailure);
  iVar3 = (int)(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[1];
  local_190._1_1_ = iVar3 == 0;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d03e0;
  local_190 = local_190 & 0xffffffff;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  local_180._8_4_ = iVar3;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xd2;
  macroName_28.m_size = 5;
  macroName_28.m_start = "CHECK";
  capturedExpression_28.m_size = 0x25;
  capturedExpression_28.m_start = "1 == chunk.orbitalMomentumValues()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_28,(SourceLineInfo *)local_198,capturedExpression_28,
             ContinueOnFailure);
  local_188 = (vector<double,_std::allocator<double>_> *)
              (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_180._M_allocated_capacity =
       (size_type)
       ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start + 1);
  lVar4 = ((long)((long)local_188 - local_180._M_allocated_capacity) >> 3) % 6;
  local_170 = (double)(6 - lVar4);
  if (lVar4 == 0) {
    local_170 = 0.0;
  }
  local_180._8_8_ = 6;
  local_167 = 1;
  local_40 = &local_190;
  local_48._M_current = (double *)local_180._M_allocated_capacity;
  local_38 = &local_168;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_40,&local_48,1);
  bStack_157 = (int)*local_48._M_current == 1;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d03e0;
  uStack_154 = 1;
  local_150 = (ITransientExpression *)0x1957cd;
  local_148 = (WithinRelMatcher *)0x2;
  local_140 = CONCAT44(local_140._4_4_,(int)*local_48._M_current);
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xd3;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x1f;
  capturedExpression_29.m_start = "0., WithinRel( chunk.SCH()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_29,(SourceLineInfo *)local_198,capturedExpression_29,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[2]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xd4;
  macroName_30.m_size = 10;
  macroName_30.m_start = "CHECK_THAT";
  capturedExpression_30.m_size = 0x1f;
  capturedExpression_30.m_start = ".5, WithinRel( chunk.SCH()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_30,(SourceLineInfo *)local_198,capturedExpression_30,
             ContinueOnFailure);
  local_118._M_current = (double *)0x3fe0000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150 = (ITransientExpression *)
              ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + 2);
  local_f8 = local_160;
  local_148 = (WithinRelMatcher *)0x6;
  lVar4 = ((long)unique0x00012000 - (long)local_150 >> 3) % 6;
  local_140 = 6 - lVar4;
  if (lVar4 == 0) {
    local_140 = 0;
  }
  local_100._M_current = (double *)local_150;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_f8,&local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_198,*local_100._M_current);
  local_138.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_198,(double *)&local_118);
  local_138.m_isBinaryExpression = true;
  local_138._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02e0;
  local_128 = &local_118;
  local_120 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,&local_138);
  Catch::ITransientExpression::~ITransientExpression(&local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xd5;
  macroName_31.m_size = 10;
  macroName_31.m_start = "CHECK_THAT";
  capturedExpression_31.m_size = 0x2d;
  capturedExpression_31.m_start = "0., WithinRel( chunk.channelSpinValues()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_31,(SourceLineInfo *)local_198,capturedExpression_31,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[2]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xd6;
  macroName_32.m_size = 10;
  macroName_32.m_start = "CHECK_THAT";
  capturedExpression_32.m_size = 0x2d;
  capturedExpression_32.m_start = ".5, WithinRel( chunk.channelSpinValues()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_32,(SourceLineInfo *)local_198,capturedExpression_32,
             ContinueOnFailure);
  local_118._M_current = (double *)0x3fe0000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150 = (ITransientExpression *)
              ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + 2);
  local_148 = (WithinRelMatcher *)0x6;
  lVar4 = ((long)unique0x00012000 - (long)local_150 >> 3) % 6;
  local_140 = 6 - lVar4;
  if (lVar4 == 0) {
    local_140 = 0;
  }
  local_e8 = local_160;
  local_f0._M_current = (double *)local_150;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_e8,&local_f0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_198,*local_f0._M_current);
  local_138.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_198,(double *)&local_118);
  local_138.m_isBinaryExpression = true;
  local_138._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02e0;
  local_128 = &local_118;
  local_120 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,&local_138);
  Catch::ITransientExpression::~ITransientExpression(&local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xd7;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x1f;
  capturedExpression_33.m_start = "0., WithinRel( chunk.BND()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_33,(SourceLineInfo *)local_198,capturedExpression_33,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[3]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xd8;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x1f;
  capturedExpression_34.m_start = "2., WithinRel( chunk.BND()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_34,(SourceLineInfo *)local_198,capturedExpression_34,
             ContinueOnFailure);
  local_118._M_current = (double *)0x4000000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150 = (ITransientExpression *)
              ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + 3);
  local_148 = (WithinRelMatcher *)0x6;
  lVar4 = ((long)unique0x00012000 - (long)local_150 >> 3) % 6;
  local_140 = 6 - lVar4;
  if (lVar4 == 0) {
    local_140 = 0;
  }
  local_d8 = local_160;
  local_e0._M_current = (double *)local_150;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_d8,&local_e0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_198,*local_e0._M_current);
  local_138.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_198,(double *)&local_118);
  local_138.m_isBinaryExpression = true;
  local_138._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02e0;
  local_128 = &local_118;
  local_120 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,&local_138);
  Catch::ITransientExpression::~ITransientExpression(&local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xd9;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x33;
  capturedExpression_35.m_start = "0., WithinRel( chunk.boundaryConditionValues()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_35,(SourceLineInfo *)local_198,capturedExpression_35,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[3]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xda;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x33;
  capturedExpression_36.m_start = "2., WithinRel( chunk.boundaryConditionValues()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_36,(SourceLineInfo *)local_198,capturedExpression_36,
             ContinueOnFailure);
  local_118._M_current = (double *)0x4000000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150 = (ITransientExpression *)
              ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + 3);
  local_148 = (WithinRelMatcher *)0x6;
  lVar4 = ((long)unique0x00012000 - (long)local_150 >> 3) % 6;
  local_140 = 6 - lVar4;
  if (lVar4 == 0) {
    local_140 = 0;
  }
  local_c8 = local_160;
  local_d0._M_current = (double *)local_150;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_c8,&local_d0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_198,*local_d0._M_current);
  local_138.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_198,(double *)&local_118);
  local_138.m_isBinaryExpression = true;
  local_138._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02e0;
  local_128 = &local_118;
  local_120 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,&local_138);
  Catch::ITransientExpression::~ITransientExpression(&local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xdb;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x1f;
  capturedExpression_37.m_start = "0., WithinRel( chunk.APT()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_37,(SourceLineInfo *)local_198,capturedExpression_37,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[5]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xdc;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x28;
  capturedExpression_38.m_start = "5.437300e-1, WithinRel( chunk.APT()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_38,(SourceLineInfo *)local_198,capturedExpression_38,
             ContinueOnFailure);
  local_118._M_current = (double *)0x3fe1663c74fb54a0;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150 = (ITransientExpression *)
              ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + 5);
  local_148 = (WithinRelMatcher *)0x6;
  lVar4 = ((long)unique0x00012000 - (long)local_150 >> 3) % 6;
  local_140 = 6 - lVar4;
  if (lVar4 == 0) {
    local_140 = 0;
  }
  local_b8 = local_160;
  local_c0._M_current = (double *)local_150;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_b8,&local_c0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_198,*local_c0._M_current);
  local_138.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_198,(double *)&local_118);
  local_138.m_isBinaryExpression = true;
  local_138._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02e0;
  local_128 = &local_118;
  local_120 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,&local_138);
  Catch::ITransientExpression::~ITransientExpression(&local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xdd;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x2c;
  capturedExpression_39.m_start = "0., WithinRel( chunk.trueChannelRadii()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_39,(SourceLineInfo *)local_198,capturedExpression_39,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[5]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xde;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x35;
  capturedExpression_40.m_start = "5.437300e-1, WithinRel( chunk.trueChannelRadii()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_40,(SourceLineInfo *)local_198,capturedExpression_40,
             ContinueOnFailure);
  local_118._M_current = (double *)0x3fe1663c74fb54a0;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150 = (ITransientExpression *)
              ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + 5);
  local_148 = (WithinRelMatcher *)0x6;
  lVar4 = ((long)unique0x00012000 - (long)local_150 >> 3) % 6;
  local_140 = 6 - lVar4;
  if (lVar4 == 0) {
    local_140 = 0;
  }
  local_a8 = local_160;
  local_b0._M_current = (double *)local_150;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_a8,&local_b0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_198,*local_b0._M_current);
  local_138.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_198,(double *)&local_118);
  local_138.m_isBinaryExpression = true;
  local_138._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02e0;
  local_128 = &local_118;
  local_120 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,&local_138);
  Catch::ITransientExpression::~ITransientExpression(&local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xdf;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x1f;
  capturedExpression_41.m_start = "0., WithinRel( chunk.APE()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_41,(SourceLineInfo *)local_198,capturedExpression_41,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[4]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xe0;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x28;
  capturedExpression_42.m_start = "5.437310e-1, WithinRel( chunk.APE()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_42,(SourceLineInfo *)local_198,capturedExpression_42,
             ContinueOnFailure);
  local_118._M_current = (double *)0x3fe1663e8dda48b6;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150 = (ITransientExpression *)
              ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + 4);
  local_148 = (WithinRelMatcher *)0x6;
  lVar4 = ((long)unique0x00012000 - (long)local_150 >> 3) % 6;
  local_140 = 6 - lVar4;
  if (lVar4 == 0) {
    local_140 = 0;
  }
  local_98 = local_160;
  local_a0._M_current = (double *)local_150;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_98,&local_a0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_198,*local_a0._M_current);
  local_138.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_198,(double *)&local_118);
  local_138.m_isBinaryExpression = true;
  local_138._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02e0;
  local_128 = &local_118;
  local_120 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,&local_138);
  Catch::ITransientExpression::~ITransientExpression(&local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xe1;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x31;
  capturedExpression_43.m_start = "0., WithinRel( chunk.effectiveChannelRadii()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_43,(SourceLineInfo *)local_198,capturedExpression_43,
             ContinueOnFailure);
  local_138._vptr_ITransientExpression = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_198,
             (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[4]);
  bVar2 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_198,(double *)&local_138);
  bStack_157 = bVar2;
  local_160[8] = true;
  local_160._0_8_ = &PTR_streamReconstructedExpression_001d02e0;
  local_150 = &local_138;
  local_148 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_160);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_160);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xe2;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x3a;
  capturedExpression_44.m_start = "5.437310e-1, WithinRel( chunk.effectiveChannelRadii()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_44,(SourceLineInfo *)local_198,capturedExpression_44,
             ContinueOnFailure);
  local_108 = 0.543731;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_150 = (ITransientExpression *)
              ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start + 4);
  local_148 = (WithinRelMatcher *)0x6;
  lVar4 = ((long)unique0x00012000 - (long)local_150 >> 3) % 6;
  local_140 = 6 - lVar4;
  if (lVar4 == 0) {
    local_140 = 0;
  }
  local_110 = local_160;
  local_118._M_current = (double *)local_150;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_110,&local_118,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_198,*local_118._M_current);
  local_138.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_198,&local_108);
  local_138.m_isBinaryExpression = true;
  local_138._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001d02e0;
  local_128 = (iterator_t<CRng> *)&local_108;
  local_120 = (WithinRelMatcher *)local_198;
  Catch::AssertionHandler::handleExpr(&local_1e0,&local_138);
  Catch::ITransientExpression::~ITransientExpression(&local_138);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_198 = (undefined1  [8])0x194488;
  local_190 = (pointer)0xe4;
  macroName_45.m_size = 5;
  macroName_45.m_start = "CHECK";
  capturedExpression_45.m_size = 0xf;
  capturedExpression_45.m_start = "3 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&local_1e0,macroName_45,(SourceLineInfo *)local_198,capturedExpression_45,
             ContinueOnFailure);
  local_180._8_8_ =
       (((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  local_190._1_1_ = local_180._8_8_ == 3;
  local_190._0_1_ = true;
  local_198 = (undefined1  [8])&PTR_streamReconstructedExpression_001d0320;
  local_190._4_4_ = 3;
  local_188 = (vector<double,_std::allocator<double>_> *)0x1957cd;
  local_180._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_1e0,(ITransientExpression *)local_198);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_198);
  Catch::AssertionHandler::complete(&local_1e0);
  if (local_1e0.m_completed == false) {
    (*(local_1e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunk( const ResonanceChannels& chunk ) {

  CHECK_THAT( 0.5, WithinRel( chunk.AJ() ) );
  CHECK_THAT( 0.5, WithinRel( chunk.spin() ) );
  CHECK_THAT( 0., WithinRel( chunk.PJ() ) );
  CHECK_THAT( 0., WithinRel( chunk.parity() ) );
  CHECK( 0 == chunk.KBK() );
  CHECK( 0 == chunk.numberBackgroundChannels() );
  CHECK( 0 == chunk.KPS() );
  CHECK( 0 == chunk.phaseShiftOption() );
  CHECK( 2 == chunk.NCH() );
  CHECK( 2 == chunk.numberChannels() );

  CHECK( 2 == chunk.PPI().size() );
  CHECK( 2 == chunk.particlePairNumbers().size() );
  CHECK( 2 == chunk.L().size() );
  CHECK( 2 == chunk.orbitalMomentumValues().size() );
  CHECK( 2 == chunk.SCH().size() );
  CHECK( 2 == chunk.channelSpinValues().size() );
  CHECK( 2 == chunk.BND().size() );
  CHECK( 2 == chunk.boundaryConditionValues().size() );
  CHECK( 2 == chunk.APT().size() );
  CHECK( 2 == chunk.trueChannelRadii().size() );
  CHECK( 2 == chunk.APE().size() );
  CHECK( 2 == chunk.effectiveChannelRadii().size() );

  CHECK( 1 == chunk.PPI()[0] );
  CHECK( 2 == chunk.PPI()[1] );
  CHECK( 1 == chunk.particlePairNumbers()[0] );
  CHECK( 2 == chunk.particlePairNumbers()[1] );
  CHECK( 0 == chunk.L()[0] );
  CHECK( 1 == chunk.L()[1] );
  CHECK( 0 == chunk.orbitalMomentumValues()[0] );
  CHECK( 1 == chunk.orbitalMomentumValues()[1] );
  CHECK_THAT( 0., WithinRel( chunk.SCH()[0] ) );
  CHECK_THAT( .5, WithinRel( chunk.SCH()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.channelSpinValues()[0] ) );
  CHECK_THAT( .5, WithinRel( chunk.channelSpinValues()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.BND()[0] ) );
  CHECK_THAT( 2., WithinRel( chunk.BND()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.boundaryConditionValues()[0] ) );
  CHECK_THAT( 2., WithinRel( chunk.boundaryConditionValues()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.APT()[0] ) );
  CHECK_THAT( 5.437300e-1, WithinRel( chunk.APT()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.trueChannelRadii()[0] ) );
  CHECK_THAT( 5.437300e-1, WithinRel( chunk.trueChannelRadii()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.APE()[0] ) );
  CHECK_THAT( 5.437310e-1, WithinRel( chunk.APE()[1] ) );
  CHECK_THAT( 0., WithinRel( chunk.effectiveChannelRadii()[0] ) );
  CHECK_THAT( 5.437310e-1, WithinRel( chunk.effectiveChannelRadii()[1] ) );

  CHECK( 3 == chunk.NC() );
}